

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
SplitBranch<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>,_0UL>
::get(SplitBranch<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>,_0UL>
      *this,ExceptionOrValue *output)

{
  bool bVar1;
  ExceptionOrValue *pEVar2;
  PromiseArenaMember *pPVar3;
  
  pEVar2 = ((this->super_ForkBranchBase).hub.ptr)->resultRef;
  bVar1 = output[1].exception.ptr.isSet;
  if (pEVar2[1].exception.ptr.isSet == true) {
    if (bVar1 != false) {
      output[1].exception.ptr.isSet = false;
      pPVar3 = (PromiseArenaMember *)output[1].exception.ptr.field_1.value.ownFile.content.ptr;
      if (pPVar3 != (PromiseArenaMember *)0x0) {
        output[1].exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
        PromiseDisposer::dispose(pPVar3);
      }
    }
    output[1].exception.ptr.field_1.value.ownFile.content.ptr =
         pEVar2[1].exception.ptr.field_1.value.ownFile.content.ptr;
    pEVar2[1].exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    output[1].exception.ptr.isSet = true;
  }
  else if (bVar1 != false) {
    output[1].exception.ptr.isSet = false;
    pPVar3 = (PromiseArenaMember *)output[1].exception.ptr.field_1.value.ownFile.content.ptr;
    if (pPVar3 != (PromiseArenaMember *)0x0) {
      output[1].exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      PromiseDisposer::dispose(pPVar3);
    }
  }
  if (pEVar2 != output) {
    if ((output->exception).ptr.isSet == true) {
      (output->exception).ptr.isSet = false;
      Exception::~Exception(&(output->exception).ptr.field_1.value);
    }
    if ((pEVar2->exception).ptr.isSet == true) {
      Exception::Exception
                (&(output->exception).ptr.field_1.value,&(pEVar2->exception).ptr.field_1.value);
      (output->exception).ptr.isSet = true;
    }
  }
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_SOME(value, hubResult.value) {
      output.as<Element>().value = kj::mv(kj::get<index>(value));
    } else {
      output.as<Element>().value = kj::none;
    }